

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

double __thiscall slang::SVInt::toDouble(SVInt *this)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  bitwidth_t bVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  double extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  optional<long> oVar14;
  optional<unsigned_long> oVar15;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  uint local_40;
  char local_3c;
  byte local_3b;
  double local_38;
  double dStack_30;
  SVInt local_20;
  
  SVInt((SVInt *)&local_48,&this->super_SVIntStorage);
  if (local_3b == 1) {
    flattenUnknowns((SVInt *)&local_48);
  }
  if (local_3c == '\x01') {
    oVar14 = as<long>((SVInt *)&local_48);
    if (((undefined1  [16])
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_38 = (double)oVar14.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_payload;
      dStack_30 = extraout_XMM0_Qb;
      goto LAB_0028bd25;
    }
  }
  else {
    oVar15 = as<unsigned_long>((SVInt *)&local_48);
    if (((undefined1  [16])
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      auVar13._8_4_ =
           oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload._4_4_;
      auVar13._0_8_ =
           oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      auVar13._12_4_ = 0x45300000;
      dStack_30 = auVar13._8_8_ - 1.9342813113834067e+25;
      local_38 = dStack_30 +
                 ((double)CONCAT44(0x43300000,
                                   oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload
                                   .super__Optional_payload_base<unsigned_long>._M_payload._0_4_) -
                 4503599627370496.0);
      goto LAB_0028bd25;
    }
  }
  if (local_3c == '\x01') {
    bVar3 = isNegative((SVInt *)&local_48);
    if (!bVar3) goto LAB_0028bbfe;
    operator-(&local_20);
    operator=((SVInt *)&local_48,&local_20);
    ~SVInt(&local_20);
    bVar3 = true;
  }
  else {
LAB_0028bbfe:
    bVar3 = false;
  }
  bVar4 = getActiveBits((SVInt *)&local_48);
  uVar1 = bVar4 - 1;
  uVar9 = uVar1 >> 6;
  uVar7 = 0x40;
  if ((bVar4 & 0x3f) != 0) {
    uVar7 = bVar4 & 0x3f;
  }
  aVar8.pVal = (uint64_t *)&local_48;
  if ((local_3b & 1) != 0) {
    aVar8 = local_48;
  }
  if (0x40 < local_40) {
    aVar8 = local_48;
  }
  uVar5 = aVar8.pVal[uVar9];
  cVar2 = (char)uVar7;
  if (uVar1 < 0x40 || 0x34 < uVar7) {
    if (0x35 < uVar7) {
      uVar11 = ~(-1L << (cVar2 - 0x35U & 0x3f)) & uVar5;
      bVar6 = cVar2 - 0x36;
      uVar5 = uVar5 >> (cVar2 - 0x35U & 0x3f);
      goto LAB_0028bc88;
    }
  }
  else {
    uVar9 = uVar9 - 1;
    bVar6 = cVar2 + 0xbU & 0x3f;
    uVar5 = aVar8.pVal[uVar9] >> bVar6 | uVar5 << 0x40 - bVar6;
    uVar11 = ~(-1L << (cVar2 + 0xbU & 0x3f)) & aVar8.pVal[uVar9];
    bVar6 = cVar2 + 10;
LAB_0028bc88:
    uVar12 = 1L << (bVar6 & 0x3f);
    if (uVar12 < uVar11) {
LAB_0028bc96:
      uVar5 = uVar5 + 1;
    }
    else if (uVar11 == uVar12) {
      if ((uVar5 & 1) != 0) goto LAB_0028bc96;
      iVar10 = uVar9 + 1;
      do {
        iVar10 = iVar10 + -1;
        if (iVar10 == 0) goto LAB_0028bcb5;
      } while (aVar8.pVal[uVar9 - 1] == 0);
      uVar5 = uVar5 | 1;
    }
  }
LAB_0028bcb5:
  uVar11 = (ulong)(uVar5 == 0x20000000000000) + (ulong)uVar1;
  if (uVar11 < 0x400) {
    local_38 = (double)((uVar5 & 0xfffffffffffff | uVar11 << 0x34 | (ulong)bVar3 << 0x3f) +
                       0x3ff0000000000000);
    dStack_30 = 0.0;
  }
  else if (bVar3) {
    local_38 = -INFINITY;
    dStack_30 = 0.0;
  }
  else {
    local_38 = INFINITY;
    dStack_30 = 0.0;
  }
LAB_0028bd25:
  ~SVInt((SVInt *)&local_48);
  return local_38;
}

Assistant:

double SVInt::toDouble() const {
    return toIEEE754<double, 11, 52, 1023>(*this);
}